

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O2

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  storage_type *psVar1;
  QWidget *pQVar2;
  QMenuBar *this_00;
  QStatusBar *this_01;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QArrayDataPointer<char16_t> local_48;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (local_48.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("MainWindow",0xb);
    QVar3.m_data = psVar1;
    QVar3.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar3);
    QObject::setObjectName((QString *)MainWindow);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QWidget::resize((QWidget *)MainWindow,800,600);
  pQVar2 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar2,MainWindow,0);
  this->centralwidget = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("centralwidget",0xe);
  QVar4.m_data = psVar1;
  QVar4.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar4);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QMainWindow::setCentralWidget((QWidget *)MainWindow);
  this_00 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_00,(QWidget *)MainWindow);
  this->menubar = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("menubar",8);
  QVar5.m_data = psVar1;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0xe0000031f;
  QWidget::setGeometry((QRect *)this->menubar);
  QMainWindow::setMenuBar((QMenuBar *)MainWindow);
  this_01 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(this_01,(QWidget *)MainWindow);
  this->statusbar = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("statusbar",10);
  QVar6.m_data = psVar1;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QMainWindow::setStatusBar((QStatusBar *)MainWindow);
  retranslateUi(this,MainWindow);
  QMetaObject::connectSlotsByName((QObject *)MainWindow);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(800, 600);
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        MainWindow->setCentralWidget(centralwidget);
        menubar = new QMenuBar(MainWindow);
        menubar->setObjectName(QString::fromUtf8("menubar"));
        menubar->setGeometry(QRect(0, 0, 800, 15));
        MainWindow->setMenuBar(menubar);
        statusbar = new QStatusBar(MainWindow);
        statusbar->setObjectName(QString::fromUtf8("statusbar"));
        MainWindow->setStatusBar(statusbar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }